

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

void __thiscall FM::OPNABase::Mix6(OPNABase *this,Sample *buffer,int nsamples,int activech)

{
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  int panr;
  int panl;
  uint c_2;
  int lrouts [2];
  uint c_1;
  uint c;
  ISample out [6];
  Sample *local_48;
  Sample *dest;
  Sample *limit;
  uint activechmask [6];
  int activech_local;
  int nsamples_local;
  Sample *buffer_local;
  OPNABase *this_local;
  
  activechmask[0] = 0x10;
  activechmask[1] = 0x40;
  activechmask[2] = 0x100;
  activechmask[3] = 0x400;
  activechmask[4] = activech;
  activechmask[5] = nsamples;
  for (local_48 = buffer; local_48 < buffer + (nsamples << 1); local_48 = local_48 + 2) {
    if ((activechmask[4] & 0xaaa) == 0) {
      for (lrouts[0] = 0; (uint)lrouts[0] < 6; lrouts[0] = lrouts[0] + 1) {
        if ((activechmask[(ulong)(uint)lrouts[0] - 2] & activechmask[4]) == 0) {
          local_98 = 0;
        }
        else {
          local_98 = Channel4::Calc((Channel4 *)
                                    (this->adpcmreg + (ulong)(uint)lrouts[0] * 0x2e0 + 0xf));
        }
        (&c_1)[(uint)lrouts[0]] = local_98;
      }
    }
    else {
      LFO(this);
      for (lrouts[1] = 0; (uint)lrouts[1] < 6; lrouts[1] = lrouts[1] + 1) {
        if ((activechmask[(ulong)(uint)lrouts[1] - 2] & activechmask[4]) == 0) {
          local_94 = 0;
        }
        else {
          local_94 = Channel4::CalcL((Channel4 *)
                                     (this->adpcmreg + (ulong)(uint)lrouts[1] * 0x2e0 + 0xf));
        }
        (&c_1)[(uint)lrouts[1]] = local_94;
      }
    }
    memset(&panl,0,8);
    for (panr = 0; (uint)panr < 6; panr = panr + 1) {
      local_9c = (uint)this->panvolume_l[(uint)panr];
      local_a0 = (uint)this->panvolume_r[(uint)panr];
      if ((this->pan[(uint)panr] & 2) == 0) {
        local_9c = 0;
      }
      if ((this->pan[(uint)panr] & 1) == 0) {
        local_a0 = 0;
      }
      panl = (int)((&c_1)[(uint)panr] * local_9c) / 0xffff + panl;
      c_2 = (int)((&c_1)[(uint)panr] * local_a0) / 0xffff + c_2;
    }
    StoreSample(local_48,panl);
    StoreSample(local_48 + 1,c_2);
  }
  return;
}

Assistant:

void OPNABase::Mix6(Sample* buffer, int nsamples, int activech)
{
	// Mix
	// libOPNMIDI: rewrite for panning support

	const uint activechmask[6] = {0x001, 0x004, 0x010, 0x040, 0x100, 0x400};

	Sample* limit = buffer + nsamples * 2;
	for (Sample* dest = buffer; dest < limit; dest+=2)
	{
		ISample out[6];
		if (activech & 0xaaa)
		{
			LFO();
			for (uint c = 0; c<6; ++c)
				out[c] = (activechmask[c] & activech) ? ch[c].CalcL() : 0;
		}
		else
		{
			for (uint c = 0; c<6; ++c)
				out[c] = (activechmask[c] & activech) ? ch[c].Calc() : 0;
		}

		int lrouts[2] = {0, 0};
		for (uint c = 0; c<6; ++c)
		{
			int panl = panvolume_l[c];
			int panr = panvolume_r[c];
			panl = (pan[c] & 2) ? panl : 0;
			panr = (pan[c] & 1) ? panr : 0;
			lrouts[0] += out[c] * panl / 65535;
			lrouts[1] += out[c] * panr / 65535;
		}

		StoreSample(dest[0], lrouts[0]);
		StoreSample(dest[1], lrouts[1]);
	}
}